

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O0

TermSpec * __thiscall Kernel::RobSubstitution::derefBound(RobSubstitution *this,TermSpec *t_)

{
  bool bVar1;
  TermSpec *in_RSI;
  TermSpec *in_RDI;
  VarSpec VVar2;
  Option<const_Kernel::TermSpec_&> binding;
  TermSpec *t;
  undefined4 in_stack_ffffffffffffffc4;
  OptionBaseRef<const_Kernel::TermSpec_*> local_28;
  TermSpec *local_20;
  
  local_20 = in_RSI;
  while( true ) {
    bVar1 = Kernel::TermSpec::isTerm((TermSpec *)0x95a8bc);
    if (bVar1) {
      return local_20;
    }
    VVar2 = Kernel::TermSpec::varSpec(in_RDI);
    Lib::DHMap<Kernel::VarSpec,_Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>::find
              ((DHMap<Kernel::VarSpec,_Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               VVar2._self._content._content,
               (VarSpec *)CONCAT44(in_stack_ffffffffffffffc4,VVar2.index));
    bVar1 = Lib::Option::operator_cast_to_bool((Option<const_Kernel::TermSpec_&> *)0x95a91d);
    if (!bVar1) break;
    local_20 = Lib::OptionBaseRef<const_Kernel::TermSpec_*>::unwrap(&local_28);
  }
  return local_20;
}

Assistant:

TermSpec const& RobSubstitution::derefBound(TermSpec const& t_) const
{
  TermSpec const* t = &t_;
  for(;;) {
    if (t->isTerm()) {
      return *t;
    } else {
      auto binding = _bindings.find(t->varSpec());
      if (!binding) {
        return *t;
      } else {
        t = &binding.unwrap();
      }
    }
  }
}